

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmersenne.h
# Opt level: O0

void __thiscall CVmMT19937::seed(CVmMT19937 *this,char *buf,size_t len)

{
  ulong uVar1;
  unsigned_long uVar2;
  ulong in_RDX;
  long in_RSI;
  CVmMT19937 *in_RDI;
  uint32_t seed;
  int k;
  int j;
  int i;
  size_t i_1;
  int mul;
  uint32_t partial;
  size_t icnt;
  int local_58;
  ulong local_50;
  int local_3c;
  int local_38;
  int local_34;
  ulong local_30;
  int local_28;
  int local_24;
  
  base_seed(in_RDI,0x12bd6aa);
  uVar1 = in_RDX + 3 >> 2;
  local_24 = 0;
  if (in_RDX < uVar1 << 2) {
    local_28 = 1;
    for (local_30 = in_RDX & 0xfffffffffffffffc; local_30 < in_RDX; local_30 = local_30 + 1) {
      local_24 = *(char *)(in_RSI + local_30) * local_28 + local_24;
      local_28 = local_28 << 8;
    }
  }
  local_34 = 1;
  local_38 = 0;
  local_50 = uVar1;
  if (uVar1 < 0x270) {
    local_50 = 0x270;
  }
  for (local_3c = (int)local_50; local_3c != 0; local_3c = local_3c + -1) {
    if ((int)in_RDX < (local_38 + 1) * 4) {
      local_58 = local_24;
    }
    else {
      uVar2 = ::osrp4((void *)(in_RSI + (local_38 << 2)));
      local_58 = (int)uVar2;
    }
    in_RDI->mt[local_34] =
         (in_RDI->mt[local_34] ^
         (in_RDI->mt[local_34 + -1] ^ in_RDI->mt[local_34 + -1] >> 0x1e) * 0x19660d) + local_58 +
         local_38;
    local_34 = local_34 + 1;
    if (0x26f < local_34) {
      in_RDI->mt[0] = in_RDI->mt[0x26f];
      local_34 = 1;
    }
    local_38 = local_38 + 1;
    if ((int)uVar1 <= local_38) {
      local_38 = 0;
    }
  }
  for (local_3c = 0x26f; local_3c != 0; local_3c = local_3c + -1) {
    in_RDI->mt[local_34] =
         (in_RDI->mt[local_34] ^
         (in_RDI->mt[local_34 + -1] ^ in_RDI->mt[local_34 + -1] >> 0x1e) * 0x5d588b65) - local_34;
    local_34 = local_34 + 1;
    if (0x26f < local_34) {
      in_RDI->mt[0] = in_RDI->mt[0x26f];
      local_34 = 1;
    }
  }
  in_RDI->mt[0] = 0x80000000;
  in_RDI->idx = 0;
  for (local_34 = 0; local_34 < 0x271; local_34 = local_34 + 1) {
    rand(in_RDI);
  }
  return;
}

Assistant:

void seed(const char *buf, size_t len)
    {
        /*
         *   Use the mechanism from the reference implementation for seeding
         *   from multiple values.  First do a fixed seeding of the mt array
         *   to fill it with nonzero bits. 
         */
        base_seed(19650218);

        /* treat the source as an array of int32s */
        size_t icnt = (len + 3)/4;

        /* if there's a partial int32 at the end, figure its value */
        uint32_t partial = 0;
        if (icnt*4 > len)
        {
            int mul = 1;
            for (size_t i = (len/4)*4 ; i < len ; ++i, mul *= 256)
                partial += buf[i]*mul;
        }

        /* 
         *   do a pass over the mt array, doing the sort of LCG
         *   initialization we do with a single int seed, but folding each
         *   seed value into the running LCG feedback register
         */
        int i = 1, j = 0, k = NMT > icnt ? NMT : icnt;
        for ( ; k != 0 ; --k)
        {
            /* get the current seed (the last one might be partial) */
            uint32_t seed = (j+1)*4 <= (int)len ? osrp4(buf + j*4) : partial;
           
            /* generate an LCG value mixing in this seed value */
            mt[i] = (mt[i] ^ ((mt[i-1] ^ (mt[i-1] >> 30)) * 0x19660D))
                    + seed + j;

            /* on to the next mt index, wrapping at the end */
            if (++i >= NMT)
            {
                mt[0] = mt[NMT-1];
                i = 1;
            }

            /* on to the next seed index, wrapping at the end */
            if (++j >= (int)icnt)
                j = 0;
        }

        /* make another pass over the mt array */
        for (k = NMT-1 ; k != 0 ; --k)
        {
            mt[i] = (mt[i] ^ ((mt[i-1] ^ (mt[i-1] >> 30)) * 0x5D588B65)) - i;
            if (++i >= NMT)
            {
                mt[0] = mt[NMT-1];
                i = 1;
            }
        }

        /* and finally, make sure the initial array isn't all zeros */
        mt[0] = 0x80000000UL;

        /* flush out the first full mt array */
        idx = 0;
        for (i = 0 ; i <= NMT ; ++i)
            rand();
    }